

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::TwoWayPipeEnd>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::TwoWayPipeEnd> *this,void *pointer)

{
  long *plVar1;
  bool bVar2;
  Runnable local_20;
  void *local_18;
  
  if (pointer != (void *)0x0) {
    bVar2 = UnwindDetector::isUnwinding((UnwindDetector *)((long)pointer + 0x30));
    if (bVar2) {
      local_20._vptr_Runnable = (_func_int **)&PTR_run_0044ba30;
      local_18 = pointer;
      UnwindDetector::catchExceptionsAsSecondaryFaults
                ((UnwindDetector *)((long)pointer + 0x30),&local_20);
    }
    else {
      anon_unknown_77::AsyncPipe::shutdownWrite(*(AsyncPipe **)((long)pointer + 0x28));
      anon_unknown_77::AsyncPipe::abortRead(*(AsyncPipe **)((long)pointer + 0x18));
    }
    plVar1 = *(long **)((long)pointer + 0x28);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x28) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x20))
                (*(undefined8 **)((long)pointer + 0x20),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    plVar1 = *(long **)((long)pointer + 0x18);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x10))
                (*(undefined8 **)((long)pointer + 0x10),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
  }
  operator_delete(pointer,0x38);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }